

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.h
# Opt level: O2

void MD5::Encode(uchar *output,UINT4 *input,uint len)

{
  ulong uVar1;
  
  for (uVar1 = 0; len + 3 >> 2 != uVar1; uVar1 = uVar1 + 1) {
    output[uVar1 * 4] = (uchar)input[uVar1];
    output[uVar1 * 4 + 1] = *(uchar *)((long)input + uVar1 * 4 + 1);
    output[uVar1 * 4 + 2] = *(uchar *)((long)input + uVar1 * 4 + 2);
    output[uVar1 * 4 + 3] = *(uchar *)((long)input + uVar1 * 4 + 3);
  }
  return;
}

Assistant:

static void Encode( unsigned char *output, UINT4 *input, unsigned int len )
  {
    unsigned int i, j;

    for (i = 0, j = 0; j < len; i++, j += 4) {
      output[j] = (unsigned char)(input[i] & 0xff);
      output[j+1] = (unsigned char)((input[i] >> 8) & 0xff);
      output[j+2] = (unsigned char)((input[i] >> 16) & 0xff);
      output[j+3] = (unsigned char)((input[i] >> 24) & 0xff);
    }
  }